

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominance.cpp
# Opt level: O0

void __thiscall
mocker::DominatorTree::buildImmediateDominator(DominatorTree *this,FunctionModule *func)

{
  bool bVar1;
  bool bVar2;
  BasicBlockList *this_00;
  size_t sVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  mapped_type *this_01;
  reference pvVar6;
  bool local_c1;
  value_type_conflict otherDominator;
  const_iterator __end3;
  const_iterator __begin3;
  mapped_type *__range3;
  bool flag;
  value_type_conflict dominator;
  const_iterator __end2;
  const_iterator __begin2;
  mapped_type *__range2;
  mapped_type *Dominators;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  size_t local_40;
  size_t node;
  BasicBlock *bb;
  const_iterator __end1;
  const_iterator __begin1;
  BasicBlockList *__range1;
  FunctionModule *func_local;
  DominatorTree *this_local;
  
  this_00 = ir::FunctionModule::getBBs_abi_cxx11_(func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_00);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_00);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&bb);
    if (!bVar1) {
      return;
    }
    node = (size_t)std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    sVar3 = ir::BasicBlock::getLabelID((BasicBlock *)node);
    local_40 = sVar3;
    if (((this->reverse & 1U) == 0) &&
       (sVar4 = ir::FunctionModule::getFirstBBLabel(func), sVar3 == sVar4)) {
      pmVar5 = std::
               unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->immediateDominator,&local_40);
      *pmVar5 = 0xffffffffffffffff;
    }
    else {
      local_c1 = false;
      if ((this->reverse & 1U) != 0) {
        ir::BasicBlock::getSuccessors(&local_58,(BasicBlock *)node);
        local_c1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&local_58);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_58);
      }
      if (local_c1 == false) {
        this_01 = std::
                  unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                  ::at(&this->dominators,&local_40);
        __end2 = std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::begin(this_01);
        dominator = (value_type_conflict)
                    std::
                    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::end(this_01);
        while (bVar1 = std::__detail::operator!=
                                 (&__end2.super__Node_iterator_base<unsigned_long,_false>,
                                  (_Node_iterator_base<unsigned_long,_false> *)&dominator), bVar1) {
          pvVar6 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                             (&__end2);
          sVar3 = *pvVar6;
          if (sVar3 != local_40) {
            bVar1 = true;
            __end3 = std::
                     unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     ::begin(this_01);
            otherDominator =
                 (value_type_conflict)
                 std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::end(this_01);
            while (bVar2 = std::__detail::operator!=
                                     (&__end3.super__Node_iterator_base<unsigned_long,_false>,
                                      (_Node_iterator_base<unsigned_long,_false> *)&otherDominator),
                  bVar2) {
              pvVar6 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                                 (&__end3);
              if ((*pvVar6 != local_40) && (bVar2 = isStrictlyDominating(this,sVar3,*pvVar6), bVar2)
                 ) {
                bVar1 = false;
                break;
              }
              std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end3);
            }
            if (bVar1) {
              pmVar5 = std::
                       unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                       ::operator[](&this->immediateDominator,&local_40);
              *pmVar5 = sVar3;
              break;
            }
          }
          std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end2);
        }
      }
      else {
        pmVar5 = std::
                 unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[](&this->immediateDominator,&local_40);
        *pmVar5 = 0xffffffffffffffff;
      }
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  } while( true );
}

Assistant:

void DominatorTree::buildImmediateDominator(const ir::FunctionModule &func) {
  // For a faster algorithm, see [Lengauer, Tarjan, 1979]

  for (const auto &bb : func.getBBs()) {
    auto node = bb.getLabelID();
    if (!reverse && node == func.getFirstBBLabel()) {
      immediateDominator[node] = std::size_t(-1);
      continue;
    }
    if (reverse && bb.getSuccessors().empty()) {
      immediateDominator[node] = std::size_t(-1);
      continue;
    }

    const auto &Dominators = dominators.at(node);
    for (auto dominator : Dominators) {
      if (dominator == node) // is not strict
        continue;
      bool flag = true;
      for (auto otherDominator : Dominators) {
        if (otherDominator == node)
          continue;
        if (isStrictlyDominating(dominator, otherDominator)) {
          flag = false;
          break;
        }
      }
      if (flag) {
        immediateDominator[node] = dominator;
        break;
      }
    }
  }
}